

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day18.cpp
# Opt level: O1

void day18(input_t input)

{
  undefined8 *puVar1;
  undefined2 uVar2;
  undefined1 auVar3 [32];
  longlong alVar4 [4];
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  pointer pMVar11;
  pointer pMVar12;
  pointer pMVar13;
  long lVar14;
  _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *p_Var15;
  pointer pMVar16;
  bool bVar17;
  int iVar18;
  size_t i;
  ulong uVar19;
  uint32_t tree;
  int iVar20;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  undefined1 (*pauVar21) [32];
  char *__s;
  Map *__cur;
  int iVar22;
  pointer pMVar23;
  value_type_conflict3 *__x;
  _Link_type __x_00;
  uint uVar24;
  int iVar25;
  pointer pMVar26;
  pointer pMVar27;
  pointer pMVar28;
  Map *__cur_1;
  pointer pMVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> pVar39;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> seen;
  Map A;
  char *local_1a18;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> local_1a10;
  value_type_conflict3 local_19e0;
  undefined1 auStack_19de [30];
  undefined1 local_19c0 [32];
  undefined1 auStack_19a0 [32];
  undefined1 auStack_1980 [3104];
  undefined1 local_d60 [64];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *this;
  
  pMVar11 = DAT_00186978;
  pMVar29 = (anonymous_namespace)::History::V;
  pMVar23 = (pointer)input.len;
  pMVar26 = (pointer)input.s;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a10._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar27 = pMVar26;
  local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ulong)(((long)DAT_00186980 - (long)(anonymous_namespace)::History::V >> 6) *
             -0x505050505050505) < 1000) {
    pMVar23 = (pointer)0x20;
    pMVar13 = (pointer)operator_new(0x31ce00,0x20);
    pMVar12 = DAT_00186978;
    pMVar27 = (anonymous_namespace)::History::V;
    pMVar16 = pMVar13;
    in_RDX = extraout_RDX;
    for (pMVar28 = (anonymous_namespace)::History::V; pMVar28 != pMVar12; pMVar28 = pMVar28 + 1) {
      pMVar23 = pMVar28;
      memcpy(pMVar16,pMVar28,0xcc0);
      pMVar16 = pMVar16 + 1;
      in_RDX = extraout_RDX_00;
    }
    if (pMVar27 != (pointer)0x0) {
      pMVar23 = (pointer)((long)DAT_00186980 - (long)pMVar27);
      operator_delete(pMVar27,(ulong)pMVar23,0x20);
      in_RDX = extraout_RDX_01;
    }
    DAT_00186978 = (pointer)(((long)pMVar11 - (long)pMVar29) + (long)pMVar13);
    DAT_00186980 = pMVar13 + 1000;
    (anonymous_namespace)::History::V = pMVar13;
  }
  pMVar29 = DAT_00186978;
  if (DAT_00186978 == DAT_00186980) {
    p_Var15 = (_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
               *)std::
                 vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
                 _M_check_len((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                               *)pMVar27,(size_type)pMVar23,in_RDX);
    pMVar11 = DAT_00186978;
    pMVar27 = (anonymous_namespace)::History::V;
    pMVar23 = std::
              _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
              ::_M_allocate(p_Var15,(size_t)pMVar23);
    lVar14 = (long)pMVar29 - (long)pMVar27;
    puVar1 = (undefined8 *)((long)pMVar23 + lVar14);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1 = (undefined8 *)((long)pMVar23 + lVar14 + 0xca0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    auVar31 = _DAT_00116760;
    pauVar21 = (undefined1 (*) [32])((long)pMVar23 + lVar14 + 0x40);
    uVar19 = 0xfffffffffffffffe;
    auVar30._8_8_ = 0x1111111111111111;
    auVar30._0_8_ = 0x1111111111111111;
    auVar30._16_8_ = 0x1111111111111111;
    auVar30._24_8_ = 0x1111111111111111;
    do {
      auVar33 = vpand_avx2((undefined1  [32])(pMVar26->V)._M_elems[0],auVar31);
      auVar3 = vpand_avx2(auVar30,*(undefined1 (*) [32])pMVar26->pad0);
      pauVar21[-1] = auVar3;
      *pauVar21 = auVar33;
      pMVar26 = (pointer)((long)(pMVar26->V)._M_elems[0] + 0x13);
      uVar19 = uVar19 + 2;
      pauVar21 = pauVar21 + 2;
      pMVar16 = pMVar23;
      pMVar28 = pMVar27;
    } while (uVar19 < 0x62);
    for (; pMVar28 != pMVar29; pMVar28 = pMVar28 + 1) {
      memcpy(pMVar16,pMVar28,0xcc0);
      pMVar16 = pMVar16 + 1;
    }
    for (; pMVar16 = pMVar16 + 1, pMVar11 != pMVar29; pMVar29 = pMVar29 + 1) {
      memcpy(pMVar16,pMVar29,0xcc0);
    }
    if (pMVar27 != (pointer)0x0) {
      operator_delete(pMVar27,(long)DAT_00186980 - (long)pMVar27,0x20);
    }
    DAT_00186980 = pMVar23 + (long)p_Var15;
    (anonymous_namespace)::History::V = pMVar23;
    DAT_00186978 = pMVar16;
  }
  else {
    DAT_00186978->pad0[0] = 0;
    DAT_00186978->pad0[1] = 0;
    DAT_00186978->pad0[2] = 0;
    DAT_00186978->pad0[3] = 0;
    DAT_00186978->pad1[0] = 0;
    DAT_00186978->pad1[1] = 0;
    DAT_00186978->pad1[2] = 0;
    DAT_00186978->pad1[3] = 0;
    auVar31 = _DAT_00116760;
    uVar19 = 0xfffffffffffffffe;
    auVar33._8_8_ = 0x1111111111111111;
    auVar33._0_8_ = 0x1111111111111111;
    auVar33._16_8_ = 0x1111111111111111;
    auVar33._24_8_ = 0x1111111111111111;
    pMVar23 = DAT_00186978;
    do {
      pMVar29 = (pointer)((pMVar23->V)._M_elems + 1);
      auVar30 = vpand_avx2((undefined1  [32])(pMVar26->V)._M_elems[0],auVar31);
      alVar4 = (longlong  [4])vpand_avx2(auVar33,*(undefined1 (*) [32])pMVar26->pad0);
      (pMVar23->V)._M_elems[0] = alVar4;
      *(undefined1 (*) [32])pMVar29->pad0 = auVar30;
      pMVar26 = (pointer)((long)(pMVar26->V)._M_elems[0] + 0x13);
      uVar19 = uVar19 + 2;
      pMVar23 = pMVar29;
    } while (uVar19 < 0x62);
    DAT_00186978 = DAT_00186978 + 1;
  }
  __x = &local_19e0;
  local_19e0 = 0;
  this = &local_1a10;
  pVar39 = std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
           ::insert(this,__x);
  __s = pVar39._8_8_;
  local_1a18 = (char *)0x0;
  do {
    pMVar23 = DAT_00186978;
    local_d60 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    lVar14 = -0xca1;
    do {
      auVar31 = vpaddb_avx2(*(undefined1 (*) [32])((long)DAT_00186978->pad0 + lVar14),
                            *(undefined1 (*) [32])((long)DAT_00186978->pad0 + lVar14 + 1));
      auVar31 = vpaddb_avx2(auVar31,*(undefined1 (*) [32])((long)DAT_00186978->pad0 + lVar14 + 2));
      *(undefined1 (*) [32])(local_d60 + lVar14 + 0x21) = auVar31;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != -0x21);
    auVar31._2_30_ = auStack_19de;
    auVar31._0_2_ = local_19e0;
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    uVar19 = 0xfffffffffffffffe;
    lVar14 = 0;
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = local_19c0;
    do {
      auVar33 = vpaddb_avx2(auVar31,*(undefined1 (*) [32])(auStack_19a0 + lVar14));
      auVar31 = vpsubb_avx2(auVar33,auVar35._0_32_);
      auVar35 = ZEXT3264(*(undefined1 (*) [32])(auStack_19de + lVar14 + -2));
      auVar3 = vpaddb_avx2(auVar30,*(undefined1 (*) [32])(auStack_1980 + lVar14));
      auVar30 = vpsubb_avx2(auVar3,auVar37._0_32_);
      auVar37 = ZEXT3264(*(undefined1 (*) [32])(local_19c0 + lVar14));
      auVar33 = vpsubb_avx2(auVar33,*(undefined1 (*) [32])((long)DAT_00186978 + lVar14 + -0xca0));
      *(undefined1 (*) [32])(auStack_19de + lVar14 + -2) = auVar33;
      auVar33 = vpsubb_avx2(auVar3,*(undefined1 (*) [32])((long)DAT_00186978 + lVar14 + -0xc80));
      *(undefined1 (*) [32])(local_19c0 + lVar14) = auVar33;
      uVar19 = uVar19 + 2;
      lVar14 = lVar14 + 0x40;
    } while (uVar19 < 0x62);
    local_d20 = 0;
    uStack_d18 = 0;
    uStack_d10 = 0;
    uStack_d08 = 0;
    local_80 = 0;
    uStack_78 = 0;
    uStack_70 = 0;
    uStack_68 = 0;
    lVar14 = 0x20;
    bVar17 = false;
    do {
      auVar31 = *(undefined1 (*) [32])((long)DAT_00186978[-1].pad0 + lVar14);
      auVar30 = *(undefined1 (*) [32])
                 ((long)&local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar14)
      ;
      auVar33 = vpsrlq_avx2(auVar30,4);
      auVar36[8] = 0xf;
      auVar36._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar36[9] = 0xf;
      auVar36[10] = 0xf;
      auVar36[0xb] = 0xf;
      auVar36[0xc] = 0xf;
      auVar36[0xd] = 0xf;
      auVar36[0xe] = 0xf;
      auVar36[0xf] = 0xf;
      auVar36[0x10] = 0xf;
      auVar36[0x11] = 0xf;
      auVar36[0x12] = 0xf;
      auVar36[0x13] = 0xf;
      auVar36[0x14] = 0xf;
      auVar36[0x15] = 0xf;
      auVar36[0x16] = 0xf;
      auVar36[0x17] = 0xf;
      auVar36[0x18] = 0xf;
      auVar36[0x19] = 0xf;
      auVar36[0x1a] = 0xf;
      auVar36[0x1b] = 0xf;
      auVar36[0x1c] = 0xf;
      auVar36[0x1d] = 0xf;
      auVar36[0x1e] = 0xf;
      auVar36[0x1f] = 0xf;
      auVar33 = vpand_avx2(auVar33,auVar36);
      auVar38[8] = 2;
      auVar38._0_8_ = 0x202020202020202;
      auVar38[9] = 2;
      auVar38[10] = 2;
      auVar38[0xb] = 2;
      auVar38[0xc] = 2;
      auVar38[0xd] = 2;
      auVar38[0xe] = 2;
      auVar38[0xf] = 2;
      auVar38[0x10] = 2;
      auVar38[0x11] = 2;
      auVar38[0x12] = 2;
      auVar38[0x13] = 2;
      auVar38[0x14] = 2;
      auVar38[0x15] = 2;
      auVar38[0x16] = 2;
      auVar38[0x17] = 2;
      auVar38[0x18] = 2;
      auVar38[0x19] = 2;
      auVar38[0x1a] = 2;
      auVar38[0x1b] = 2;
      auVar38[0x1c] = 2;
      auVar38[0x1d] = 2;
      auVar38[0x1e] = 2;
      auVar38[0x1f] = 2;
      uVar5 = vpcmpgtb_avx512vl(auVar33,auVar38);
      auVar30 = vpand_avx2(auVar30,auVar36);
      uVar6 = vptestnmb_avx512vl(auVar33,auVar33);
      uVar7 = vptestnmb_avx512vl(auVar30,auVar30);
      auVar34[8] = 0x10;
      auVar34._0_8_ = 0x1010101010101010;
      auVar34[9] = 0x10;
      auVar34[10] = 0x10;
      auVar34[0xb] = 0x10;
      auVar34[0xc] = 0x10;
      auVar34[0xd] = 0x10;
      auVar34[0xe] = 0x10;
      auVar34[0xf] = 0x10;
      auVar34[0x10] = 0x10;
      auVar34[0x11] = 0x10;
      auVar34[0x12] = 0x10;
      auVar34[0x13] = 0x10;
      auVar34[0x14] = 0x10;
      auVar34[0x15] = 0x10;
      auVar34[0x16] = 0x10;
      auVar34[0x17] = 0x10;
      auVar34[0x18] = 0x10;
      auVar34[0x19] = 0x10;
      auVar34[0x1a] = 0x10;
      auVar34[0x1b] = 0x10;
      auVar34[0x1c] = 0x10;
      auVar34[0x1d] = 0x10;
      auVar34[0x1e] = 0x10;
      auVar34[0x1f] = 0x10;
      uVar19 = vpcmpeqb_avx512vl(auVar31,auVar34);
      uVar8 = vptestnmb_avx512vl(auVar31,auVar31);
      auVar33 = vpmovm2b_avx512vl(uVar5 & uVar8);
      uVar5 = vpcmpgtb_avx512vl(auVar30,auVar38);
      auVar30 = vpmovm2b_avx512vl(uVar19 & uVar5);
      auVar3._8_8_ = 0x1111111111111111;
      auVar3._0_8_ = 0x1111111111111111;
      auVar3._16_8_ = 0x1111111111111111;
      auVar3._24_8_ = 0x1111111111111111;
      auVar30 = vpandq_avx512vl(auVar30,auVar3);
      auVar9._8_8_ = 0x1010101010101010;
      auVar9._0_8_ = 0x1010101010101010;
      auVar9._16_8_ = 0x1010101010101010;
      auVar9._24_8_ = 0x1010101010101010;
      auVar33 = vpternlogq_avx512vl(auVar30,auVar33,auVar9,0x78);
      auVar32[8] = 1;
      auVar32._0_8_ = 0x101010101010101;
      auVar32[9] = 1;
      auVar32[10] = 1;
      auVar32[0xb] = 1;
      auVar32[0xc] = 1;
      auVar32[0xd] = 1;
      auVar32[0xe] = 1;
      auVar32[0xf] = 1;
      auVar32[0x10] = 1;
      auVar32[0x11] = 1;
      auVar32[0x12] = 1;
      auVar32[0x13] = 1;
      auVar32[0x14] = 1;
      auVar32[0x15] = 1;
      auVar32[0x16] = 1;
      auVar32[0x17] = 1;
      auVar32[0x18] = 1;
      auVar32[0x19] = 1;
      auVar32[0x1a] = 1;
      auVar32[0x1b] = 1;
      auVar32[0x1c] = 1;
      auVar32[0x1d] = 1;
      auVar32[0x1e] = 1;
      auVar32[0x1f] = 1;
      uVar19 = vpcmpeqb_avx512vl(auVar31,auVar32);
      auVar30 = vpmovm2b_avx512vl(((uint)uVar6 | (uint)uVar7) & uVar19);
      auVar10._8_8_ = 0x101010101010101;
      auVar10._0_8_ = 0x101010101010101;
      auVar10._16_8_ = 0x101010101010101;
      auVar10._24_8_ = 0x101010101010101;
      auVar30 = vpandq_avx512vl(auVar30,auVar10);
      auVar31 = vpternlogq_avx512vl(auVar30,auVar31,auVar33,0x96);
      if (bVar17) {
        auVar31 = vpand_avx2(auVar31,_DAT_00116760);
      }
      *(undefined1 (*) [32])((long)&local_d20 + lVar14) = auVar31;
      bVar17 = (bool)(bVar17 ^ 1);
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0xca0);
    if (DAT_00186978 == DAT_00186980) {
      p_Var15 = (_Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                 *)std::
                   vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::
                   _M_check_len((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                                 *)this,(size_type)__x,__s);
      pMVar26 = DAT_00186978;
      pMVar11 = (anonymous_namespace)::History::V;
      pMVar16 = std::
                _Vector_base<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
                ::_M_allocate(p_Var15,(size_t)__x);
      memcpy((void *)((long)pMVar16 + ((long)pMVar23 - (long)pMVar11)),&local_d20,0xcc0);
      pMVar29 = pMVar16;
      for (pMVar27 = pMVar11; pMVar23 != pMVar27; pMVar27 = pMVar27 + 1) {
        memcpy(pMVar29,pMVar27,0xcc0);
        pMVar29 = pMVar29 + 1;
      }
      for (; pMVar29 = pMVar29 + 1, pMVar26 != pMVar23; pMVar23 = pMVar23 + 1) {
        memcpy(pMVar29,pMVar23,0xcc0);
      }
      if (pMVar11 != (pointer)0x0) {
        operator_delete(pMVar11,(long)DAT_00186980 - (long)pMVar11,0x20);
      }
      DAT_00186980 = pMVar16 + (long)p_Var15;
      (anonymous_namespace)::History::V = pMVar16;
      DAT_00186978 = pMVar29;
    }
    else {
      memcpy(DAT_00186978,&local_d20,0xcc0);
      DAT_00186978 = pMVar23 + 1;
    }
    this = &local_1a10;
    local_19e0 = (value_type_conflict3)local_1a10._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __x = &local_19e0;
    pVar39 = std::
             set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::
             insert(this,__x);
    __s = pVar39._8_8_;
    if (((undefined1  [16])pVar39 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar2 = (undefined2)pVar39.first._M_node._M_node[1]._M_color;
      __x = (value_type_conflict3 *)(ulong)(ushort)uVar2;
      uVar24 = (int)local_1a10._M_t._M_impl.super__Rb_tree_header._M_node_count -
               (uint)(ushort)uVar2;
      this = (set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *
             )(ulong)uVar24;
      __s = (char *)(ulong)((1000000000 - (ushort)uVar2) % uVar24 + (uint)(ushort)uVar2);
      local_1a18 = __s;
    }
  } while (((undefined1  [16])pVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  iVar22 = 0;
  lVar14 = -0xc80;
  iVar18 = 0;
  do {
    auVar31 = *(undefined1 (*) [32])((long)(anonymous_namespace)::History::V[10].pad1 + lVar14);
    auVar30 = vpsllq_avx2(auVar31,3);
    iVar22 = iVar22 + POPCOUNT((uint)(SUB321(auVar30 >> 7,0) & 1) |
                               (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    auVar31 = vpsllq_avx2(auVar31,7);
    iVar18 = iVar18 + POPCOUNT((uint)(SUB321(auVar31 >> 7,0) & 1) |
                               (uint)(SUB321(auVar31 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar31 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar31 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar31 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar31 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar31 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar31 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar31 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar31 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar31 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar31 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar31 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar31 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar31 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar31 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar31 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar31 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar31 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar31 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar31 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar31 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar31 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar31 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar31 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar31 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar31 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar31 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar31 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar31 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar31 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar31[0x1f] >> 7) << 0x1f);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  iVar20 = 0;
  lVar14 = 0x20;
  iVar25 = 0;
  do {
    auVar31 = *(undefined1 (*) [32])
               ((long)(anonymous_namespace)::History::V[(long)local_1a18].pad0 + lVar14);
    auVar30 = vpsllq_avx2(auVar31,3);
    iVar20 = iVar20 + POPCOUNT((uint)(SUB321(auVar30 >> 7,0) & 1) |
                               (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    auVar31 = vpsllq_avx2(auVar31,7);
    iVar25 = iVar25 + POPCOUNT((uint)(SUB321(auVar31 >> 7,0) & 1) |
                               (uint)(SUB321(auVar31 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar31 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar31 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar31 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar31 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar31 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar31 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar31 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar31 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar31 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar31 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar31 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar31 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar31 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar31 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar31 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar31 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar31 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar31 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar31 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar31 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar31 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar31 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar31 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar31 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar31 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar31 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar31 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar31 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar31 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar31[0x1f] >> 7) << 0x1f);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0xca0);
  __x_00 = (_Link_type)(ulong)(uint)(iVar22 * iVar18);
  printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n",__x_00,(ulong)(uint)(iVar20 * iVar25));
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
  ::_M_erase((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
              *)local_1a10._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x_00);
  return;
}

Assistant:

void day18(input_t input) {
	std::set<uint16_t, History> seen;
	History::V.reserve(1000);
	History::V.emplace_back(input.s);
	seen.insert(0);

	uint32_t idx = 0;
	for (;;) {
		History::V.push_back(History::V.back().advance());
		auto result = seen.insert(seen.size());
		if (!result.second) {
			uint32_t base = *result.first, loop = seen.size() - base;
			idx = base + (1000000000 - base) % loop;
			break;
		}
	}

	printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n", History::V[10].value(), History::V[idx].value());
}